

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

size_t ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl,UA_Job **jobs,UA_UInt16 timeout)

{
  undefined8 *puVar1;
  UA_ServerCallback *pp_Var2;
  ServerNetworkLayerTCP *layer;
  UA_Logger logger;
  int iVar3;
  undefined8 uVar4;
  UA_UInt32 UVar5;
  UA_UInt32 UVar6;
  UA_UInt32 UVar7;
  UA_Int32 UVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  UA_StatusCode UVar13;
  UA_Job *__ptr;
  UA_Connection *pUVar14;
  uint *puVar15;
  char *pcVar16;
  ConnectionMapping *pCVar17;
  ulong uVar18;
  size_t sVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  undefined1 local_180 [8];
  fd_set errset;
  fd_set fdset;
  timeval tmptv;
  socklen_t addrlen;
  int i;
  sockaddr_in addr;
  
  layer = (ServerNetworkLayerTCP *)nl->handle;
  sVar19 = layer->mappingsSize;
  __ptr = (UA_Job *)malloc(sVar19 << 6);
  if (__ptr == (UA_Job *)0x0) {
    sVar19 = 0x80030000;
  }
  else {
    if (sVar19 == 0) {
      lVar21 = 0;
    }
    else {
      lVar20 = 0;
      lVar21 = 0;
      uVar18 = 0;
      do {
        pUVar14 = *(UA_Connection **)((long)&layer->mappings->connection + lVar20);
        if ((pUVar14 == (UA_Connection *)0x0) || (pUVar14->state == UA_CONNECTION_CLOSED)) {
          __ptr[lVar21].type = UA_JOBTYPE_DETACHCONNECTION;
          __ptr[lVar21].job.closeConnection = pUVar14;
          pCVar17 = layer->mappings + (layer->mappingsSize - 1);
          uVar4 = *(undefined8 *)&pCVar17->sockfd;
          puVar1 = (undefined8 *)((long)&layer->mappings->connection + lVar20);
          *puVar1 = pCVar17->connection;
          puVar1[1] = uVar4;
          layer->mappingsSize = layer->mappingsSize - 1;
          __ptr[lVar21 + 1].type = UA_JOBTYPE_METHODCALL_DELAYED;
          __ptr[lVar21 + 1].job.methodCall.method = FreeConnectionCallback;
          __ptr[lVar21 + 1].job.closeConnection = pUVar14;
          lVar21 = lVar21 + 2;
        }
        uVar18 = uVar18 + 1;
        lVar20 = lVar20 + 0x10;
      } while (uVar18 < layer->mappingsSize);
    }
    UVar8 = setFDSet(layer,(fd_set *)(errset.fds_bits + 0xf));
    setFDSet(layer,(fd_set *)local_180);
    fdset.fds_bits[0xf] = 0;
    tmptv.tv_sec = (ulong)timeout * 1000;
    iVar9 = select(UVar8 + 1,(fd_set *)(errset.fds_bits + 0xf),(fd_set *)0x0,(fd_set *)local_180,
                   (timeval *)(fdset.fds_bits + 0xf));
    if (iVar9 < 1 && lVar21 == 0) {
      free(__ptr);
      *jobs = (UA_Job *)0x0;
      sVar19 = 0;
    }
    else {
      uVar11 = layer->serversockfd;
      uVar10 = uVar11 + 0x3f;
      if (-1 < (int)uVar11) {
        uVar10 = uVar11;
      }
      if (((ulong)errset.fds_bits[(long)((int)uVar10 >> 6) + 0xf] >> ((ulong)uVar11 & 0x3f) & 1) !=
          0) {
        iVar9 = iVar9 + -1;
        uVar11 = accept(uVar11,(sockaddr *)0x0,(socklen_t *)0x0);
        if (-1 < (int)uVar11) {
          socket_set_nonblocking(uVar11);
          tmptv.tv_usec._4_4_ = 1;
          setsockopt(uVar11,6,1,(void *)((long)&tmptv.tv_usec + 4),4);
          pUVar14 = (UA_Connection *)malloc(0x88);
          if (pUVar14 != (UA_Connection *)0x0) {
            tmptv.tv_usec._0_4_ = 0x10;
            iVar12 = getpeername(uVar11,(sockaddr *)&addrlen,(socklen_t *)&tmptv.tv_usec);
            logger = layer->logger;
            if (iVar12 == 0) {
              pcVar16 = inet_ntoa((in_addr)i);
              UA_LOG_INFO(logger,UA_LOGCATEGORY_NETWORK,
                          "Connection %i | New connection over TCP from %s:%d",(ulong)uVar11,pcVar16
                          ,(ulong)(ushort)(addrlen._2_2_ << 8 | addrlen._2_2_ >> 8));
            }
            else {
              puVar15 = (uint *)__errno_location();
              UA_LOG_WARNING(logger,UA_LOGCATEGORY_NETWORK,
                             "Connection %i | New connection over TCP, getpeername failed with errno %i"
                             ,(ulong)uVar11,(ulong)*puVar15);
            }
            memset(pUVar14,0,0x88);
            pUVar14->sockfd = uVar11;
            pUVar14->handle = layer;
            UVar5 = (layer->conf).sendBufferSize;
            UVar6 = (layer->conf).recvBufferSize;
            UVar7 = (layer->conf).maxMessageSize;
            (pUVar14->localConf).protocolVersion = (layer->conf).protocolVersion;
            (pUVar14->localConf).sendBufferSize = UVar5;
            (pUVar14->localConf).recvBufferSize = UVar6;
            (pUVar14->localConf).maxMessageSize = UVar7;
            (pUVar14->localConf).maxChunkCount = (layer->conf).maxChunkCount;
            (pUVar14->remoteConf).maxChunkCount = (layer->conf).maxChunkCount;
            UVar5 = (layer->conf).sendBufferSize;
            UVar6 = (layer->conf).recvBufferSize;
            UVar7 = (layer->conf).maxMessageSize;
            (pUVar14->remoteConf).protocolVersion = (layer->conf).protocolVersion;
            (pUVar14->remoteConf).sendBufferSize = UVar5;
            (pUVar14->remoteConf).recvBufferSize = UVar6;
            (pUVar14->remoteConf).maxMessageSize = UVar7;
            pUVar14->send = socket_write;
            pUVar14->close = ServerNetworkLayerTCP_closeConnection;
            pUVar14->getSendBuffer = ServerNetworkLayerGetSendBuffer;
            pUVar14->releaseSendBuffer = ServerNetworkLayerReleaseSendBuffer;
            pUVar14->releaseRecvBuffer = ServerNetworkLayerReleaseRecvBuffer;
            pUVar14->state = UA_CONNECTION_OPENING;
            pCVar17 = (ConnectionMapping *)
                      realloc(layer->mappings,layer->mappingsSize * 0x10 + 0x10);
            if (pCVar17 == (ConnectionMapping *)0x0) {
              UA_LOG_ERROR(layer->logger,UA_LOGCATEGORY_NETWORK,"No memory for a new Connection");
              free(pUVar14);
            }
            else {
              layer->mappings = pCVar17;
              sVar19 = layer->mappingsSize;
              pCVar17[sVar19].connection = pUVar14;
              pCVar17[sVar19].sockfd = uVar11;
              layer->mappingsSize = sVar19 + 1;
            }
          }
        }
      }
      _addrlen = (UA_ServerCallback)0x0;
      addr.sin_family = 0;
      addr.sin_port = 0;
      addr.sin_addr.s_addr = 0;
      uVar18 = 0;
      if ((layer->mappingsSize != 0) && (iVar9 != 0)) {
        uVar22 = 1;
        lVar20 = 0;
        uVar18 = 0;
        do {
          iVar12 = *(int *)((long)&layer->mappings->sockfd + lVar20);
          iVar3 = iVar12 + 0x3f;
          if (-1 < iVar12) {
            iVar3 = iVar12;
          }
          if ((((ulong)errset.fds_bits[(long)(iVar3 >> 6) + -1] >>
                ((ulong)(uint)(iVar12 % 0x40) & 0x3f) & 1) != 0) ||
             ((errset.fds_bits[(long)(iVar3 >> 6) + 0xf] & 1L << ((byte)(iVar12 % 0x40) & 0x3f)) !=
              0)) {
            UVar13 = socket_recv(*(UA_Connection **)((long)&layer->mappings->connection + lVar20),
                                 (UA_ByteString *)&addrlen,0);
            if (UVar13 == 0x80ae0000) {
              pUVar14 = *(UA_Connection **)((long)&layer->mappings->connection + lVar20);
              UA_LOG_INFO(layer->logger,UA_LOGCATEGORY_NETWORK,
                          "Connection %i | Connection closed from remote",
                          (ulong)(uint)pUVar14->sockfd);
              __ptr[lVar21 + uVar18].type = UA_JOBTYPE_DETACHCONNECTION;
              __ptr[lVar21 + uVar18].job.closeConnection = pUVar14;
              pCVar17 = layer->mappings + (layer->mappingsSize - 1);
              uVar4 = *(undefined8 *)&pCVar17->sockfd;
              puVar1 = (undefined8 *)((long)&layer->mappings->connection + lVar20);
              *puVar1 = pCVar17->connection;
              puVar1[1] = uVar4;
              layer->mappingsSize = layer->mappingsSize - 1;
              lVar21 = lVar21 + 1;
              __ptr[lVar21 + uVar18].type = UA_JOBTYPE_METHODCALL_DELAYED;
              __ptr[lVar21 + uVar18].job.methodCall.method = FreeConnectionCallback;
              __ptr[lVar21 + uVar18].job.closeConnection = pUVar14;
            }
            else {
              if (UVar13 != 0) goto LAB_00129ea6;
              __ptr[lVar21 + uVar18].job.closeConnection =
                   *(UA_Connection **)((long)&layer->mappings->connection + lVar20);
              pp_Var2 = &__ptr[lVar21 + uVar18].job.methodCall.method;
              *pp_Var2 = _addrlen;
              pp_Var2[1] = (UA_ServerCallback)addr._0_8_;
              __ptr[lVar21 + uVar18].type = UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER;
            }
            uVar18 = uVar18 + 1;
          }
LAB_00129ea6:
          if (layer->mappingsSize <= uVar22) break;
          uVar22 = uVar22 + 1;
          lVar20 = lVar20 + 0x10;
        } while (uVar18 < (ulong)(long)iVar9);
      }
      sVar19 = lVar21 + uVar18;
      if (sVar19 == 0) {
        free(__ptr);
        __ptr = (UA_Job *)0x0;
      }
      *jobs = __ptr;
    }
  }
  return sVar19;
}

Assistant:

static size_t
ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl, UA_Job **jobs,
                              UA_UInt16 timeout) {
    /* Every open socket can generate two jobs */
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_Job *js = malloc(sizeof(UA_Job) * (size_t)((layer->mappingsSize * 2)));
    if(!js)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Remove closed sockets */
    size_t totalJobs = removeClosedConnections(layer, js);

    /* Listen on open sockets (including the server) */
    fd_set fdset, errset;
    UA_Int32 highestfd = setFDSet(layer, &fdset);
    setFDSet(layer, &errset);
    struct timeval tmptv = {0, timeout * 1000};
    UA_Int32 resultsize = select(highestfd+1, &fdset, NULL, &errset, &tmptv);
    if(totalJobs == 0 && resultsize <= 0) {
        free(js);
        *jobs = NULL;
        return 0;
    }

    /* Accept new connection via the server socket (can only be a single one) */
    if(UA_fd_isset(layer->serversockfd, &fdset)) {
        --resultsize;
        SOCKET newsockfd = accept((SOCKET)layer->serversockfd, NULL, NULL);
#ifdef _WIN32
        if(newsockfd != INVALID_SOCKET)
#else
        if(newsockfd >= 0)
#endif
        {
            socket_set_nonblocking(newsockfd);
            /* Do not merge packets on the socket (disable Nagle's algorithm) */
            int i = 1;
            setsockopt(newsockfd, IPPROTO_TCP, TCP_NODELAY, (void *)&i, sizeof(i));
            ServerNetworkLayerTCP_add(layer, (UA_Int32)newsockfd);
        }
    }

    /* Read from established sockets */
    UA_ByteString buf = UA_BYTESTRING_NULL;
    size_t j = 0;
    for(size_t i = 0; i < layer->mappingsSize && j < (size_t)resultsize; ++i) {
        if(!UA_fd_isset(layer->mappings[i].sockfd, &errset) &&
           !UA_fd_isset(layer->mappings[i].sockfd, &fdset))
          continue;

        UA_StatusCode retval = socket_recv(layer->mappings[i].connection, &buf, 0);
        if(retval == UA_STATUSCODE_GOOD) {
            js[totalJobs + j].job.binaryMessage.connection = layer->mappings[i].connection;
            js[totalJobs + j].job.binaryMessage.message = buf;
            js[totalJobs + j].type = UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER;
            ++j;
        } else if (retval == UA_STATUSCODE_BADCONNECTIONCLOSED) {
            UA_Connection *c = layer->mappings[i].connection;
            UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                        "Connection %i | Connection closed from remote", c->sockfd);
            /* the socket was closed from remote */
            js[totalJobs + j].type = UA_JOBTYPE_DETACHCONNECTION;
            js[totalJobs + j].job.closeConnection = c;
            layer->mappings[i] = layer->mappings[layer->mappingsSize-1];
            --layer->mappingsSize;
            ++totalJobs; /* increase j only once */
            js[totalJobs + j].type = UA_JOBTYPE_METHODCALL_DELAYED;
            js[totalJobs + j].job.methodCall.method = FreeConnectionCallback;
            js[totalJobs + j].job.methodCall.data = c;
            ++j;
        }
    }
    totalJobs += j;

    if(totalJobs == 0) {
        free(js);
        js = NULL;
    }
    *jobs = js;
    return totalJobs;
}